

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

isoent * isoent_find_entry(isoent *rootent,char *fn)

{
  int iVar1;
  char *in_RSI;
  isoent *in_RDI;
  int l;
  isoent *np;
  isoent *isoent;
  char name [256];
  char *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  isoent *piVar2;
  char *in_stack_fffffffffffffee8;
  char *local_10;
  
  local_10 = in_RSI;
  do {
    piVar2 = (isoent *)0x0;
    iVar1 = get_path_component(in_stack_fffffffffffffee8,(size_t)in_RDI,(char *)0x0);
    if (iVar1 == 0) {
      return piVar2;
    }
    local_10 = local_10 + iVar1;
    if (*local_10 == '/') {
      local_10 = local_10 + 1;
    }
    in_RDI = isoent_find_child((isoent *)CONCAT44(iVar1,in_stack_fffffffffffffed0),
                               in_stack_fffffffffffffec8);
    if (in_RDI == (isoent *)0x0) {
      return (isoent *)0x0;
    }
    if (*local_10 == '\0') {
      return in_RDI;
    }
  } while ((char)(in_RDI->field_0xe8 << 6) < '\0');
  return (isoent *)0x0;
}

Assistant:

static struct isoent *
isoent_find_entry(struct isoent *rootent, const char *fn)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	char name[_MAX_FNAME];/* Included null terminator size. */
#elif defined(NAME_MAX) && NAME_MAX >= 255
	char name[NAME_MAX+1];
#else
	char name[256];
#endif
	struct isoent *isoent, *np;
	int l;

	isoent = rootent;
	np = NULL;
	for (;;) {
		l = get_path_component(name, sizeof(name), fn);
		if (l == 0)
			break;
		fn += l;
		if (fn[0] == '/')
			fn++;

		np = isoent_find_child(isoent, name);
		if (np == NULL)
			break;
		if (fn[0] == '\0')
			break;/* We found out the entry */

		/* Try sub directory. */
		isoent = np;
		np = NULL;
		if (!isoent->dir)
			break;/* Not directory */
	}

	return (np);
}